

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  string *__range2;
  undefined8 uVar6;
  size_type sVar7;
  char cVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b4 = number;
  if (number == 0) {
    pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (base_name->pathname_)._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_d8,".");
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_d8,extension);
    local_f8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == paVar3) {
      local_f8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    }
    local_f8._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_70,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_b0.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    _Var5._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0011f6fe;
  }
  else {
    paVar3 = &local_b0.field_2;
    pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + (base_name->pathname_)._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_b0,"_");
    StreamableToString<int>(&local_50,&local_b4);
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      uVar6 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_50._M_string_length + local_b0._M_string_length) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar6 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_50._M_string_length + local_b0._M_string_length) goto LAB_0011f4f5;
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_50,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    }
    else {
LAB_0011f4f5:
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_b0,local_50._M_dataplus._M_p,local_50._M_string_length);
    }
    local_90._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar4) {
      local_90.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    paVar4->_M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,".");
    local_d8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar4) {
      local_d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_d8._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_d8,extension);
    local_f8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == paVar4) {
      local_f8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_f8._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_70,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar3) goto LAB_0011f6fe;
  }
  operator_delete(_Var5._M_p,local_b0.field_2._M_allocated_capacity + 1);
LAB_0011f6fe:
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  _Var5._M_p = local_f8._M_dataplus._M_p;
  if (local_f8._M_string_length != 0) {
    sVar7 = 0;
    do {
      cVar8 = local_f8._M_dataplus._M_p[sVar7];
      if (((cVar8 != '/') || (cVar8 = '/', _Var5._M_p == local_f8._M_dataplus._M_p)) ||
         (_Var5._M_p[-1] != '/')) {
        *_Var5._M_p = cVar8;
        _Var5._M_p = _Var5._M_p + 1;
      }
      sVar7 = sVar7 + 1;
    } while (local_f8._M_string_length != sVar7);
  }
  local_f8._M_string_length = (long)_Var5._M_p - (long)local_f8._M_dataplus._M_p;
  *_Var5._M_p = '\0';
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name, int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file =
        base_name.string() + "_" + StreamableToString(number) + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}